

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O2

LY_ERR lyb_print_data(ly_out *out,lyd_node *root,uint32_t options)

{
  lys_module **pplVar1;
  lylyb_ctx *plVar2;
  lyd_node_inner *plVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  lyd_ctx *lydctx;
  anon_struct_24_3_37108ca1 *paVar6;
  lysc_node *plVar7;
  lyd_node_inner *node;
  lys_module *plVar8;
  lyd_node_inner *plVar9;
  lyd_node_inner *plVar10;
  ly_ctx *ctx;
  lylyb_ctx *lybctx;
  lys_module *plVar11;
  ulong uVar12;
  uint8_t zero;
  char local_59;
  ly_set *local_58;
  lylyb_ctx *local_50;
  lyd_node_inner *local_48;
  lyd_node_inner *local_40;
  char local_34 [4];
  
  zero = '\0';
  if (root == (lyd_node *)0x0) {
    ctx = (ly_ctx *)0x0;
  }
  else {
    if (root->schema == (lysc_node *)0x0) {
      plVar5 = (lys_module *)&root[2].schema;
    }
    else {
      plVar5 = root->schema->module;
    }
    ctx = plVar5->ctx;
  }
  lydctx = (lyd_ctx *)calloc(1,0x1080);
  if (lydctx != (lyd_ctx *)0x0) {
    paVar6 = (anon_struct_24_3_37108ca1 *)calloc(1,0x38);
    lydctx->data_ctx = paVar6;
    if (paVar6 != (anon_struct_24_3_37108ca1 *)0x0) {
      lydctx->parse_opts = options;
      if (root != (lyd_node *)0x0) {
        paVar6->ctx = ctx;
        if ((root->schema != (lysc_node *)0x0) &&
           (plVar7 = lysc_data_node(root->schema->parent), plVar7 != (lysc_node *)0x0)) {
          LVar4 = LY_EINVAL;
          ly_log(lydctx->data_ctx->ctx,LY_LLERR,LY_EINVAL,
                 "LYB printer supports only printing top-level nodes.");
          goto LAB_0013c3a6;
        }
      }
      local_34[2] = 0x62;
      local_34[0] = 'l';
      local_34[1] = 'y';
      LVar4 = ly_write_(out,local_34,3);
      if (LVar4 == LY_SUCCESS) {
        local_59 = '\x05';
        LVar4 = ly_write_(out,&local_59,1);
        if (LVar4 == LY_SUCCESS) {
          lybctx = (lylyb_ctx *)lydctx->data_ctx;
          LVar4 = ly_set_new(&local_58);
          plVar10 = (lyd_node_inner *)root;
          plVar2 = lybctx;
          if (LVar4 == LY_SUCCESS) {
            for (; local_50 = plVar2, node = plVar10, plVar3 = plVar10,
                plVar10 != (lyd_node_inner *)0x0;
                plVar10 = (lyd_node_inner *)(plVar10->field_0).node.next) {
              while (local_48 = plVar3, node != (lyd_node_inner *)0x0) {
                plVar7 = (node->field_0).node.schema;
                local_40 = node;
                if (plVar7 == (lysc_node *)0x0) {
                  node = (lyd_node_inner *)lyd_child((lyd_node *)node);
                  plVar9 = local_40;
                  plVar10 = local_48;
                  lybctx = local_50;
                  if (node != (lyd_node_inner *)0x0) goto LAB_0013c4b5;
                }
                else {
                  plVar5 = plVar7->module;
                  LVar4 = ly_set_add(local_58,plVar5,'\0',(uint32_t *)0x0);
                  if (LVar4 != LY_SUCCESS) goto LAB_0013c4f6;
                  plVar11 = (lys_module *)0x0;
                  while( true ) {
                    pplVar1 = plVar5->deviated_by;
                    if (pplVar1 == (lys_module **)0x0) {
                      plVar8 = (lys_module *)0x0;
                    }
                    else {
                      plVar8 = pplVar1[-1];
                    }
                    if (plVar8 <= plVar11) break;
                    LVar4 = ly_set_add(local_58,pplVar1[(long)plVar11],'\0',(uint32_t *)0x0);
                    plVar11 = (lys_module *)((long)&plVar11->ctx + 1);
                    if (LVar4 != LY_SUCCESS) goto LAB_0013c4f6;
                  }
                  plVar11 = (lys_module *)0x0;
                  while( true ) {
                    pplVar1 = plVar5->augmented_by;
                    if (pplVar1 == (lys_module **)0x0) {
                      plVar8 = (lys_module *)0x0;
                    }
                    else {
                      plVar8 = pplVar1[-1];
                    }
                    if (plVar8 <= plVar11) break;
                    LVar4 = ly_set_add(local_58,pplVar1[(long)plVar11],'\0',(uint32_t *)0x0);
                    plVar11 = (lys_module *)((long)&plVar11->ctx + 1);
                    if (LVar4 != LY_SUCCESS) goto LAB_0013c4f6;
                  }
                }
                plVar9 = local_40;
                plVar10 = local_48;
                lybctx = local_50;
                if (local_40 == local_48) break;
                do {
                  node = (lyd_node_inner *)(plVar9->field_0).node.next;
LAB_0013c4b5:
                  plVar3 = local_48;
                } while ((node == (lyd_node_inner *)0x0) &&
                        (plVar9 = *(lyd_node_inner **)((long)&plVar9->field_0 + 0x10),
                        (plVar9->field_0).node.parent != (plVar10->field_0).node.parent));
              }
              plVar2 = local_50;
            }
            LVar4 = lyb_write_number((ulong)local_58->count,2,out,lybctx);
            if (LVar4 == LY_SUCCESS) {
              uVar12 = 0;
              do {
                if (local_58->count <= uVar12) {
                  LVar4 = LY_SUCCESS;
                  break;
                }
                LVar4 = lyb_print_model(out,(lys_module *)(local_58->field_2).dnodes[uVar12],'\x01',
                                        local_50);
                uVar12 = uVar12 + 1;
              } while (LVar4 == LY_SUCCESS);
            }
LAB_0013c4f6:
            ly_set_free(local_58,(_func_void_void_ptr *)0x0);
            if ((LVar4 == LY_SUCCESS) &&
               (LVar4 = lyb_print_siblings(out,root,(lyd_lyb_ctx *)lydctx), LVar4 == LY_SUCCESS)) {
              LVar4 = lyb_write(out,&zero,1,(lylyb_ctx *)lydctx->data_ctx);
            }
          }
        }
      }
      goto LAB_0013c3a6;
    }
  }
  LVar4 = LY_EMEM;
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_print_data");
LAB_0013c3a6:
  lyd_lyb_ctx_free(lydctx);
  return LVar4;
}

Assistant:

LY_ERR
lyb_print_data(struct ly_out *out, const struct lyd_node *root, uint32_t options)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t zero = 0;
    struct lyd_lyb_ctx *lybctx;
    const struct ly_ctx *ctx = root ? LYD_CTX(root) : NULL;

    lybctx = calloc(1, sizeof *lybctx);
    LY_CHECK_ERR_GOTO(!lybctx, LOGMEM(ctx); ret = LY_EMEM, cleanup);
    lybctx->lybctx = calloc(1, sizeof *lybctx->lybctx);
    LY_CHECK_ERR_GOTO(!lybctx->lybctx, LOGMEM(ctx); ret = LY_EMEM, cleanup);

    lybctx->print_options = options;
    if (root) {
        lybctx->lybctx->ctx = ctx;

        if (root->schema && lysc_data_parent(root->schema)) {
            LOGERR(lybctx->lybctx->ctx, LY_EINVAL, "LYB printer supports only printing top-level nodes.");
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* LYB magic number */
    LY_CHECK_GOTO(ret = lyb_print_magic_number(out), cleanup);

    /* LYB header */
    LY_CHECK_GOTO(ret = lyb_print_header(out), cleanup);

    /* all used models */
    LY_CHECK_GOTO(ret = lyb_print_data_models(out, root, lybctx->lybctx), cleanup);

    ret = lyb_print_siblings(out, root, lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* ending zero byte */
    LY_CHECK_GOTO(ret = lyb_write(out, &zero, sizeof zero, lybctx->lybctx), cleanup);

cleanup:
    lyd_lyb_ctx_free((struct lyd_ctx *)lybctx);
    return ret;
}